

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFalse.c
# Opt level: O0

void Gia_ManCheckFalseOne
               (Gia_Man_t *p,int iOut,int nTimeOut,Vec_Wec_t *vHooks,int fVerbose,int fVeryVerbose)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  Gia_Obj_t *pObj_00;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  sat_solver *s;
  abctime aVar9;
  Gia_Obj_t *pGVar10;
  Gia_Obj_t *pGVar11;
  int *begin;
  int *piVar12;
  Vec_Int_t *p_03;
  bool bVar13;
  abctime local_c0;
  Vec_Int_t *vHook;
  int iEnd;
  int iBeg;
  Vec_Int_t *vObjs;
  abctime aStack_80;
  int iFanin;
  abctime clkStart;
  int status;
  int Shift [2];
  int i;
  int *pLits;
  int nLits;
  Vec_Int_t *vPath;
  Vec_Int_t *vLits;
  Gia_Obj_t *pPivot;
  Gia_Obj_t *pFanin;
  Gia_Obj_t *pObj;
  sat_solver *pSat;
  int fVeryVerbose_local;
  int fVerbose_local;
  Vec_Wec_t *vHooks_local;
  int nTimeOut_local;
  int iOut_local;
  Gia_Man_t *p_local;
  
  pObj_00 = Gia_ManCo(p,iOut);
  p_00 = Vec_IntAlloc(p->nLevels);
  p_01 = Gia_ManCollectPath(p,pObj_00);
  pLits._4_4_ = 0;
  stack0xffffffffffffff98 = (int *)0x0;
  aStack_80 = Abc_Clock();
  vObjs._4_4_ = Gia_ObjFaninId0p(p,pObj_00);
  p_02 = Gia_ManCollectNodesCis(p,(int *)((long)&vObjs + 4),1);
  Shift[0] = 0;
  while( true ) {
    iVar2 = Shift[0];
    iVar1 = Vec_IntSize(p_02);
    bVar13 = false;
    if (iVar2 < iVar1) {
      iVar2 = Vec_IntEntry(p_02,Shift[0]);
      pFanin = Gia_ManObj(p,iVar2);
      bVar13 = pFanin != (Gia_Obj_t *)0x0;
    }
    if (!bVar13) break;
    iVar2 = Vec_IntSize(p_02);
    pFanin->Value = (iVar2 + -1) - Shift[0];
    Shift[0] = Shift[0] + 1;
  }
  iVar2 = Gia_ObjIsCo(pObj_00);
  if (iVar2 == 0) {
    __assert_fail("Gia_ObjIsCo(pPivot)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaFalse.c"
                  ,0xb6,"void Gia_ManCheckFalseOne(Gia_Man_t *, int, int, Vec_Wec_t *, int, int)");
  }
  s = sat_solver_new();
  if (nTimeOut == 0) {
    local_c0 = 0;
  }
  else {
    aVar9 = Abc_Clock();
    local_c0 = (long)nTimeOut * 1000000 + aVar9;
  }
  sat_solver_set_runtime_limit(s,local_c0);
  iVar2 = Vec_IntSize(p_01);
  iVar1 = Vec_IntSize(p_02);
  sat_solver_setnvars(s,iVar2 * 3 + iVar1 * 2);
  iVar2 = Vec_IntSize(p_01);
  clkStart._4_4_ = iVar2 * 3;
  iVar2 = Vec_IntSize(p_01);
  iVar1 = Vec_IntSize(p_02);
  status = iVar2 * 3 + iVar1;
  Shift[0] = 0;
  while( true ) {
    iVar2 = Shift[0];
    iVar1 = Vec_IntSize(p_02);
    bVar13 = false;
    if (iVar2 < iVar1) {
      iVar2 = Vec_IntEntry(p_02,Shift[0]);
      pFanin = Gia_ManObj(p,iVar2);
      bVar13 = pFanin != (Gia_Obj_t *)0x0;
    }
    if (!bVar13) break;
    iVar2 = Gia_ObjIsAnd(pFanin);
    if (iVar2 != 0) {
      iVar2 = pFanin->Value + clkStart._4_4_;
      pGVar10 = Gia_ObjFanin0(pFanin);
      iVar1 = pGVar10->Value + clkStart._4_4_;
      pGVar10 = Gia_ObjFanin1(pFanin);
      iVar7 = pGVar10->Value + clkStart._4_4_;
      iVar3 = Gia_ObjFaninC0(pFanin);
      iVar4 = Gia_ObjFaninC1(pFanin);
      sat_solver_add_and(s,iVar2,iVar1,iVar7,iVar3,iVar4,0);
      iVar2 = pFanin->Value + status;
      pGVar10 = Gia_ObjFanin0(pFanin);
      iVar1 = pGVar10->Value + status;
      pGVar10 = Gia_ObjFanin1(pFanin);
      iVar7 = pGVar10->Value + status;
      iVar3 = Gia_ObjFaninC0(pFanin);
      iVar4 = Gia_ObjFaninC1(pFanin);
      sat_solver_add_and(s,iVar2,iVar1,iVar7,iVar3,iVar4,0);
    }
    Shift[0] = Shift[0] + 1;
  }
  Shift[0] = 0;
  while( true ) {
    iVar2 = Shift[0];
    iVar1 = Vec_IntSize(p_01);
    bVar13 = false;
    if (iVar2 < iVar1) {
      iVar2 = Vec_IntEntry(p_01,Shift[0]);
      pFanin = Gia_ManObj(p,iVar2);
      bVar13 = pFanin != (Gia_Obj_t *)0x0;
    }
    if (!bVar13) break;
    iVar2 = Gia_ObjIsAnd(pFanin);
    if (iVar2 == 0) {
      iVar2 = Gia_ObjIsCi(pFanin);
      if (iVar2 == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaFalse.c"
                      ,0xe7,
                      "void Gia_ManCheckFalseOne(Gia_Man_t *, int, int, Vec_Wec_t *, int, int)");
      }
      sat_solver_add_xor(s,Shift[0],pFanin->Value + clkStart._4_4_,pFanin->Value + status,0);
    }
    else {
      if (Shift[0] < 1) {
        __assert_fail("i > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaFalse.c"
                      ,0xce,
                      "void Gia_ManCheckFalseOne(Gia_Man_t *, int, int, Vec_Wec_t *, int, int)");
      }
      iVar2 = Vec_IntEntry(p_01,Shift[0] + -1);
      pGVar10 = Gia_ManObj(p,iVar2);
      pGVar11 = Gia_ObjFanin0(pFanin);
      iVar2 = Shift[0];
      if (pGVar10 == pGVar11) {
        iVar1 = Vec_IntSize(p_01);
        iVar7 = Shift[0] + -1;
        iVar3 = Vec_IntSize(p_01);
        pGVar10 = Gia_ObjFanin1(pFanin);
        iVar4 = pGVar10->Value + clkStart._4_4_;
        iVar5 = Gia_ObjFaninC0(pFanin);
        iVar6 = Gia_ObjFaninC1(pFanin);
        sat_solver_add_and(s,iVar2 + iVar1,iVar7 + iVar3,iVar4,iVar5,iVar6,0);
        iVar2 = Shift[0];
        iVar1 = Vec_IntSize(p_01);
        iVar7 = Shift[0] + -1;
        iVar3 = Vec_IntSize(p_01);
        pGVar10 = Gia_ObjFanin1(pFanin);
        iVar4 = pGVar10->Value + status;
        iVar5 = Gia_ObjFaninC0(pFanin);
        iVar6 = Gia_ObjFaninC1(pFanin);
        sat_solver_add_and(s,iVar2 + iVar1 * 2,iVar7 + iVar3 * 2,iVar4,iVar5,iVar6,0);
      }
      else {
        pGVar11 = Gia_ObjFanin1(pFanin);
        iVar2 = Shift[0];
        if (pGVar10 != pGVar11) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaFalse.c"
                        ,0xe2,
                        "void Gia_ManCheckFalseOne(Gia_Man_t *, int, int, Vec_Wec_t *, int, int)");
        }
        iVar1 = Vec_IntSize(p_01);
        pGVar10 = Gia_ObjFanin0(pFanin);
        iVar7 = pGVar10->Value + clkStart._4_4_;
        iVar3 = Shift[0] + -1;
        iVar4 = Vec_IntSize(p_01);
        iVar5 = Gia_ObjFaninC0(pFanin);
        iVar6 = Gia_ObjFaninC1(pFanin);
        sat_solver_add_and(s,iVar2 + iVar1,iVar7,iVar3 + iVar4,iVar5,iVar6,0);
        iVar2 = Shift[0];
        iVar1 = Vec_IntSize(p_01);
        pGVar10 = Gia_ObjFanin0(pFanin);
        iVar7 = pGVar10->Value + status;
        iVar3 = Shift[0] + -1;
        iVar4 = Vec_IntSize(p_01);
        iVar5 = Gia_ObjFaninC0(pFanin);
        iVar6 = Gia_ObjFaninC1(pFanin);
        sat_solver_add_and(s,iVar2 + iVar1 * 2,iVar7,iVar3 + iVar4 * 2,iVar5,iVar6,0);
      }
      iVar2 = Shift[0];
      iVar7 = Vec_IntSize(p_01);
      iVar1 = Shift[0];
      iVar3 = Vec_IntSize(p_01);
      sat_solver_add_xor(s,iVar2,iVar2 + iVar7,iVar1 + iVar3 * 2,0);
    }
    iVar2 = Abc_Var2Lit(Shift[0],0);
    Vec_IntPush(p_00,iVar2);
    Shift[0] = Shift[0] + 1;
  }
  begin = Vec_IntArray(p_00);
  piVar12 = Vec_IntArray(p_00);
  iVar2 = Vec_IntSize(p_00);
  clkStart._0_4_ = sat_solver_solve(s,begin,piVar12 + iVar2,(long)nTimeOut,0,0,0);
  if ((int)clkStart == -1) {
    pLits._4_4_ = sat_solver_final(s,(int **)(Shift + 1));
    iVar2 = Abc_Lit2Var(stack0xffffffffffffff98[(int)(pLits._4_4_ - 1)]);
    iVar1 = Abc_Lit2Var(*stack0xffffffffffffff98);
    if (iVar1 - iVar2 < 0x14) {
      for (Shift[0] = Abc_MaxInt(iVar2 + -1,0); Shift[0] <= iVar1; Shift[0] = Shift[0] + 1) {
        iVar7 = Vec_IntEntry(p_01,Shift[0]);
        iVar7 = Vec_WecLevelSize(vHooks,iVar7);
        if (0 < iVar7) break;
      }
      if (iVar1 < Shift[0]) {
        iVar7 = Vec_IntEntry(p_01,iVar1);
        p_03 = Vec_WecEntry(vHooks,iVar7);
        for (Shift[0] = Abc_MaxInt(iVar2 + -1,0); Shift[0] <= iVar1; Shift[0] = Shift[0] + 1) {
          iVar2 = Vec_IntEntry(p_01,Shift[0]);
          Vec_IntPush(p_03,iVar2);
        }
      }
    }
  }
  if (fVerbose != 0) {
    uVar8 = Gia_ObjLevel(p,pObj_00);
    printf("PO %6d : Level = %3d  ",(ulong)(uint)iOut,(ulong)uVar8);
    if ((int)clkStart == 0) {
      printf("Timeout reached after %d seconds. ",(ulong)(uint)nTimeOut);
    }
    else if ((int)clkStart == 1) {
      printf("There is no false path. ");
    }
    else {
      uVar8 = Vec_IntSize(p_01);
      printf("False path contains %d nodes (out of %d):  ",(ulong)pLits._4_4_,(ulong)uVar8);
      iVar2 = Abc_Lit2Var(*stack0xffffffffffffff98);
      uVar8 = Vec_IntEntry(p_01,iVar2);
      printf("top = %d  ",(ulong)uVar8);
      if (fVeryVerbose != 0) {
        for (Shift[0] = 0; Shift[0] < (int)pLits._4_4_; Shift[0] = Shift[0] + 1) {
          uVar8 = Abc_Lit2Var(stack0xffffffffffffff98[Shift[0]]);
          printf("%d ",(ulong)uVar8);
        }
      }
      printf("  ");
    }
    aVar9 = Abc_Clock();
    Abc_PrintTime(1,"Time",aVar9 - aStack_80);
  }
  sat_solver_delete(s);
  Vec_IntFree(p_02);
  Vec_IntFree(p_01);
  Vec_IntFree(p_00);
  return;
}

Assistant:

void Gia_ManCheckFalseOne( Gia_Man_t * p, int iOut, int nTimeOut, Vec_Wec_t * vHooks, int fVerbose, int fVeryVerbose )
{
    sat_solver * pSat;
    Gia_Obj_t * pObj, * pFanin;
    Gia_Obj_t * pPivot = Gia_ManCo( p, iOut );
    Vec_Int_t * vLits = Vec_IntAlloc( p->nLevels );
    Vec_Int_t * vPath = Gia_ManCollectPath( p, pPivot );
    int nLits = 0, * pLits = NULL;
    int i, Shift[2], status;
    abctime clkStart = Abc_Clock();
    // collect objects and assign SAT variables
    int iFanin = Gia_ObjFaninId0p( p, pPivot );
    Vec_Int_t * vObjs = Gia_ManCollectNodesCis( p, &iFanin, 1 );
    Gia_ManForEachObjVec( vObjs, p, pObj, i )
        pObj->Value = Vec_IntSize(vObjs) - 1 - i;
    assert( Gia_ObjIsCo(pPivot) );
    // create SAT solver
    pSat = sat_solver_new();
    sat_solver_set_runtime_limit( pSat, nTimeOut ? nTimeOut * CLOCKS_PER_SEC + Abc_Clock(): 0 );
    sat_solver_setnvars( pSat, 3 * Vec_IntSize(vPath) + 2 * Vec_IntSize(vObjs) );
    Shift[0] = 3 * Vec_IntSize(vPath);
    Shift[1] = 3 * Vec_IntSize(vPath) + Vec_IntSize(vObjs);
    // add CNF for the cone
    Gia_ManForEachObjVec( vObjs, p, pObj, i )
    {
        if ( !Gia_ObjIsAnd(pObj) )
            continue;
        sat_solver_add_and( pSat, pObj->Value + Shift[0], 
            Gia_ObjFanin0(pObj)->Value + Shift[0], Gia_ObjFanin1(pObj)->Value + Shift[0], 
            Gia_ObjFaninC0(pObj), Gia_ObjFaninC1(pObj), 0 ); 
        sat_solver_add_and( pSat, pObj->Value + Shift[1], 
            Gia_ObjFanin0(pObj)->Value + Shift[1], Gia_ObjFanin1(pObj)->Value + Shift[1], 
            Gia_ObjFaninC0(pObj), Gia_ObjFaninC1(pObj), 0 ); 
    }
    // add CNF for the path
    Gia_ManForEachObjVec( vPath, p, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
        {
            assert( i > 0 );
            pFanin = Gia_ManObj( p, Vec_IntEntry(vPath, i-1) );
            if ( pFanin == Gia_ObjFanin0(pObj) )
            {
                sat_solver_add_and( pSat, i + 1*Vec_IntSize(vPath), 
                    i-1 + 1*Vec_IntSize(vPath), Gia_ObjFanin1(pObj)->Value + Shift[0], 
                    Gia_ObjFaninC0(pObj), Gia_ObjFaninC1(pObj), 0 ); 
                sat_solver_add_and( pSat, i + 2*Vec_IntSize(vPath), 
                    i-1 + 2*Vec_IntSize(vPath), Gia_ObjFanin1(pObj)->Value + Shift[1], 
                    Gia_ObjFaninC0(pObj), Gia_ObjFaninC1(pObj), 0 ); 
            }
            else if ( pFanin == Gia_ObjFanin1(pObj) )
            {
                sat_solver_add_and( pSat, i + 1*Vec_IntSize(vPath), 
                    Gia_ObjFanin0(pObj)->Value + Shift[0], i-1 + 1*Vec_IntSize(vPath), 
                    Gia_ObjFaninC0(pObj), Gia_ObjFaninC1(pObj), 0 ); 
                sat_solver_add_and( pSat, i + 2*Vec_IntSize(vPath), 
                    Gia_ObjFanin0(pObj)->Value + Shift[1], i-1 + 2*Vec_IntSize(vPath), 
                    Gia_ObjFaninC0(pObj), Gia_ObjFaninC1(pObj), 0 ); 
            }
            else assert( 0 );
            sat_solver_add_xor( pSat, i, i + 1*Vec_IntSize(vPath), i + 2*Vec_IntSize(vPath), 0 );
        }
        else if ( Gia_ObjIsCi(pObj) )
            sat_solver_add_xor( pSat, i, pObj->Value + Shift[0], pObj->Value + Shift[1], 0 );
        else assert( 0 );
        Vec_IntPush( vLits, Abc_Var2Lit(i, 0) );
    }
    // call the SAT solver
    status = sat_solver_solve( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits), (ABC_INT64_T)nTimeOut, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    if ( status == l_False )
    {
        int iBeg, iEnd;
        nLits = sat_solver_final( pSat, &pLits );
        iBeg  = Abc_Lit2Var(pLits[nLits-1]);
        iEnd  = Abc_Lit2Var(pLits[0]);
        if ( iEnd - iBeg < 20 )
        {
            // check if nodes on the path are already used
            for ( i = Abc_MaxInt(iBeg-1, 0); i <= iEnd; i++ )
                if ( Vec_WecLevelSize(vHooks, Vec_IntEntry(vPath, i)) > 0 )
                    break;
            if ( i > iEnd )
            {
                Vec_Int_t * vHook = Vec_WecEntry(vHooks, Vec_IntEntry(vPath, iEnd));
                for ( i = Abc_MaxInt(iBeg-1, 0); i <= iEnd; i++ )
                    Vec_IntPush( vHook, Vec_IntEntry(vPath, i) );
            }
        }
    }
    if ( fVerbose )
    {
        printf( "PO %6d : Level = %3d  ", iOut, Gia_ObjLevel(p, pPivot) );
        if ( status == l_Undef )
            printf( "Timeout reached after %d seconds. ", nTimeOut );
        else if ( status == l_True )
            printf( "There is no false path. " );
        else
        {
            printf( "False path contains %d nodes (out of %d):  ", nLits, Vec_IntSize(vPath) );
            printf( "top = %d  ", Vec_IntEntry(vPath, Abc_Lit2Var(pLits[0])) );
            if ( fVeryVerbose )
                for ( i = 0; i < nLits; i++ )
                    printf( "%d ", Abc_Lit2Var(pLits[i]) );
            printf( "  " );
        }
        Abc_PrintTime( 1, "Time", Abc_Clock() - clkStart );
    }
    sat_solver_delete( pSat );
    Vec_IntFree( vObjs );
    Vec_IntFree( vPath );
    Vec_IntFree( vLits );
}